

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initTranslationFiles(VcprojGenerator *this)

{
  char *in_RDI;
  long in_FS_OFFSET;
  ProKey *in_stack_ffffffffffffff58;
  QMakeProject *this_00;
  QString *in_stack_ffffffffffffff68;
  ProStringList *fileList;
  VCFilter *in_stack_ffffffffffffff70;
  VCFilter *this_01;
  ProStringList local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(in_stack_ffffffffffffff68,in_RDI);
  in_RDI[0x2678] = '\0';
  in_RDI[0x2679] = '\0';
  in_RDI[0x267a] = '\0';
  in_RDI[0x267b] = '\0';
  QString::operator=(in_stack_ffffffffffffff68,in_RDI);
  QString::operator=(in_stack_ffffffffffffff68,in_RDI);
  this_00 = *(QMakeProject **)(in_RDI + 0xd8);
  fileList = local_38;
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_ffffffffffffff58);
  QMakeProject::values(this_00,in_stack_ffffffffffffff58);
  VCFilter::addFiles(in_stack_ffffffffffffff70,fileList);
  ProKey::~ProKey((ProKey *)0x292f3a);
  this_01 = *(VCFilter **)(in_RDI + 0xd8);
  ProKey::ProKey((ProKey *)this_00,(char *)in_stack_ffffffffffffff58);
  QMakeProject::values(this_00,in_stack_ffffffffffffff58);
  VCFilter::addFiles(this_01,fileList);
  ProKey::~ProKey((ProKey *)0x292f87);
  *(char **)(in_RDI + 0x2680) = in_RDI;
  *(char **)(in_RDI + 0x2688) = in_RDI + 0x268;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initTranslationFiles()
{
    vcProject.TranslationFiles.Name = "Translation Files";
    vcProject.TranslationFiles.ParseFiles = _False;
    vcProject.TranslationFiles.Filter = "ts;xlf";
    vcProject.TranslationFiles.Guid = _GUIDTranslationFiles;

    vcProject.TranslationFiles.addFiles(project->values("TRANSLATIONS"));
    vcProject.TranslationFiles.addFiles(project->values("EXTRA_TRANSLATIONS"));

    vcProject.TranslationFiles.Project = this;
    vcProject.TranslationFiles.Config = &(vcProject.Configuration);
}